

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkAbsCreateFlopInputs
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Wlc_Obj_t *pCounter,int AdderBits)

{
  Wlc_Obj_t *pWVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  long lVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar17;
  long lVar18;
  ushort uVar19;
  Wlc_Obj_t *pWVar20;
  long lVar21;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObj_00;
  long lVar22;
  bool bVar23;
  
  if (0 < vNodeFrames->nSize) {
    lVar18 = 0;
    do {
      uVar3 = vNodeFrames->pArray[lVar18];
      uVar15 = (int)uVar3 >> 0xb;
      if (((int)uVar15 < 1) || (p->nObjsAlloc <= (int)uVar15)) {
LAB_0035e240:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = p->pObjs + uVar15;
      paVar12 = &p->pObjs[uVar15].field_10;
      lVar21 = 0;
      do {
        lVar13 = lVar18 * 2 + lVar21;
        if (vNewObjs->nSize <= (int)lVar13) goto LAB_0035e25f;
        lVar22 = (long)vNewObjs->pArray[lVar13];
        if ((lVar22 < 1) || (iVar4 = pNew->nObjsAlloc, iVar4 <= vNewObjs->pArray[lVar13]))
        goto LAB_0035e240;
        pWVar5 = pNew->pObjs;
        uVar2 = *(ushort *)pWVar1;
        uVar19 = uVar2 & 0x3f;
        if (uVar19 == 8) {
          if (lVar21 == 0) {
            if (((uVar2 & 0x2f) == 6) || (paVar17 = paVar12, 2 < pWVar1->nFanins)) {
              paVar17 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            iVar8 = paVar17->Fanins[0];
            if ((0 < (long)iVar8) && (iVar8 < p->nObjsAlloc)) {
              if ((p->vCopies).nSize <= iVar8) goto LAB_0035e25f;
              iVar8 = (p->vCopies).pArray[iVar8];
              lVar13 = (long)iVar8;
              if ((0 < lVar13) && (iVar8 < iVar4)) {
                if ((uVar3 & 1) == 0) goto LAB_0035ded2;
                if (vFanins->nCap < 1) {
                  if (vFanins->pArray == (int *)0x0) {
                    piVar14 = (int *)malloc(4);
                  }
                  else {
                    piVar14 = (int *)realloc(vFanins->pArray,4);
                  }
                  vFanins->pArray = piVar14;
                  if (piVar14 == (int *)0x0) goto LAB_0035e29d;
                  vFanins->nCap = 1;
                }
                *vFanins->pArray = iVar8;
                vFanins->nSize = 1;
                uVar10 = Wlc_ObjAlloc(pNew,0xf,0,0,0);
                if ((0 < (int)uVar10) && ((int)uVar10 < pNew->nObjsAlloc)) {
                  pObj = pNew->pObjs + uVar10;
                  Wlc_ObjAddFanins(pNew,pObj,vFanins);
                  goto LAB_0035dedd;
                }
              }
            }
            goto LAB_0035e240;
          }
        }
        else {
          if (uVar19 == 0x36) {
            if (lVar21 == 0) {
              if (((uVar2 & 0x2f) == 6) || (paVar17 = paVar12, 2 < pWVar1->nFanins)) {
                paVar17 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0]
                ;
              }
              iVar8 = paVar17->Fanins[1];
              uVar16 = (ulong)iVar8;
              if ((0 < (long)uVar16) && (iVar8 < p->nObjsAlloc)) {
                if ((p->vCopies).nSize <= iVar8) goto LAB_0035e25f;
                goto LAB_0035deb2;
              }
              goto LAB_0035e240;
            }
            if ((p->vCopies).nSize <= (int)uVar15) {
LAB_0035e25f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar8 = (p->vCopies).pArray[uVar15];
          }
          else {
            if (uVar19 != 0x37) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                            ,0x183,
                            "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                           );
            }
            if (lVar21 == 0) {
              if (((uVar2 & 0x2f) == 6) || (paVar17 = paVar12, 2 < pWVar1->nFanins)) {
                paVar17 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0]
                ;
              }
              uVar10 = paVar17->Fanins[1];
            }
            else {
              if (((uVar2 & 0x2f) == 6) || (paVar17 = paVar12, 2 < pWVar1->nFanins)) {
                paVar17 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0]
                ;
              }
              uVar10 = paVar17[1].Fanins[0];
            }
            if (((int)uVar10 < 1) || (p->nObjsAlloc <= (int)uVar10)) goto LAB_0035e240;
            if ((p->vCopies).nSize <= (int)uVar10) goto LAB_0035e25f;
            uVar16 = (ulong)uVar10;
LAB_0035deb2:
            iVar8 = (p->vCopies).pArray[uVar16];
          }
          lVar13 = (long)iVar8;
          if ((lVar13 < 1) || (iVar4 <= iVar8)) goto LAB_0035e240;
LAB_0035ded2:
          pObj = pWVar5 + lVar13;
LAB_0035dedd:
          iVar8 = pWVar5[lVar22].End - pWVar5[lVar22].Beg;
          iVar4 = -iVar8;
          if (0 < iVar8) {
            iVar4 = iVar8;
          }
          iVar9 = pObj->End - pObj->Beg;
          iVar8 = -iVar9;
          if (0 < iVar9) {
            iVar8 = iVar9;
          }
          if (iVar4 != iVar8) {
            __assert_fail("Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x184,
                          "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                         );
          }
          uVar10 = Wlc_ObjAlloc(pNew,6,0,AdderBits + -1,0);
          if (((int)uVar10 < 1) || (pNew->nObjsAlloc <= (int)uVar10)) goto LAB_0035e240;
          pWVar6 = pNew->pObjs;
          if (vFanins->nCap < 1) {
            if (vFanins->pArray == (int *)0x0) {
              piVar14 = (int *)malloc(4);
            }
            else {
              piVar14 = (int *)realloc(vFanins->pArray,4);
            }
            vFanins->pArray = piVar14;
            if (piVar14 == (int *)0x0) goto LAB_0035e29d;
            vFanins->nCap = 1;
          }
          *vFanins->pArray = uVar3 >> 1 & 0x3ff;
          vFanins->nSize = 1;
          Wlc_ObjAddFanins(pNew,pWVar6 + uVar10,vFanins);
          uVar11 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
          if (((int)uVar11 < 1) || (pNew->nObjsAlloc <= (int)uVar11)) goto LAB_0035e240;
          pWVar7 = pNew->pObjs;
          if (vFanins->nCap < 2) {
            if (vFanins->pArray == (int *)0x0) {
              piVar14 = (int *)malloc(8);
            }
            else {
              piVar14 = (int *)realloc(vFanins->pArray,8);
            }
            vFanins->pArray = piVar14;
            if (piVar14 == (int *)0x0) {
LAB_0035e29d:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vFanins->nCap = 2;
          }
          pObj_00 = pWVar7 + uVar11;
          piVar14 = vFanins->pArray;
          lVar13 = 0;
          do {
            pWVar20 = pCounter;
            if (lVar13 == 0) {
              pWVar20 = pWVar6 + uVar10;
            }
            piVar14[lVar13] = (int)((ulong)((long)pWVar20 - (long)pWVar7) >> 3) * -0x55555555;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 2);
          vFanins->nSize = 2;
          Wlc_ObjAddFanins(pNew,pObj_00,vFanins);
          iVar8 = pWVar5[lVar22].End - pWVar5[lVar22].Beg;
          iVar4 = -iVar8;
          if (0 < iVar8) {
            iVar4 = iVar8;
          }
          uVar10 = Wlc_ObjAlloc(pNew,8,0,iVar4,0);
          if (((int)uVar10 < 1) || (pNew->nObjsAlloc <= (int)uVar10)) goto LAB_0035e240;
          pWVar7 = pNew->pObjs;
          pWVar6 = pWVar7 + uVar10;
          vFanins->nSize = 0;
          Vec_IntPush(vFanins,(int)((ulong)((long)pObj_00 - (long)pWVar7) >> 3) * -0x55555555);
          Vec_IntPush(vFanins,(int)((ulong)((long)pWVar5 + (lVar22 * 0x18 - (long)pNew->pObjs)) >> 3
                                   ) * -0x55555555);
          Vec_IntPush(vFanins,(int)((ulong)((long)pObj - (long)pNew->pObjs) >> 3) * -0x55555555);
          Wlc_ObjAddFanins(pNew,pWVar6,vFanins);
          Wlc_ObjSetCo(pNew,pWVar6,1);
        }
        bVar23 = lVar21 == 0;
        lVar21 = lVar21 + 1;
      } while (bVar23);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vNodeFrames->nSize);
  }
  return;
}

Assistant:

void Wlc_NtkAbsCreateFlopInputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Wlc_Obj_t * pCounter, int AdderBits ) 
{
    Wlc_Obj_t * pObj, * pFanin, * pFlop, * pCond, * pMux, * pConst;
    int i, n, Entry, Value, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        Value  = Entry & 1;
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        for ( n = 0; n < 2; n++ ) // n=0 -- address   n=1 -- data
        {
            pFlop = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*i+n) );
            if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
                pFanin = Wlc_ObjCopyObj( pNew, p, n ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
                pFanin = n ? Wlc_NtkObj(pNew, Wlc_ObjCopy(p, iObj)) : Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            {
                if ( n ) continue;
                pFanin = Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin0(p, pObj) );
                if ( Value )
                {
                    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pFanin) );
                    pFanin = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_NOT, 0, 0, 0));
                    Wlc_ObjAddFanins( pNew, pFanin, vFanins );
                }
            }
            else assert( 0 );
            assert( Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin) );
            // create constant
            pConst = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, AdderBits-1, 0));
            Vec_IntFill( vFanins, 1, iFrame );
            Wlc_ObjAddFanins( pNew, pConst, vFanins );
            // create equality
            pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
            Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pConst), Wlc_ObjId(pNew, pCounter) );
            Wlc_ObjAddFanins( pNew, pCond, vFanins );
            // create MUX
            pMux = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pFlop)-1, 0));
            Vec_IntClear( vFanins );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pCond) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFlop) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFanin) );
            Wlc_ObjAddFanins( pNew, pMux, vFanins );
            Wlc_ObjSetCo( pNew, pMux, 1 );
        }
    }
}